

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontProvider.cpp
# Opt level: O2

bool __thiscall
Rml::FontProvider::LoadFontFace
          (FontProvider *this,Span<const_unsigned_char> data,int face_index,bool fallback_face,
          UniquePtr<byte[]> *face_memory,String *source,String font_family,FontStyle style,
          FontWeight weight)

{
  FontWeight FVar1;
  undefined2 uVar2;
  _Alloc_hider font_family_00;
  pointer pFVar3;
  bool bVar4;
  bool bVar5;
  undefined2 weight_00;
  int iVar6;
  int iVar7;
  FontFaceHandleFreetype in_face;
  undefined4 in_register_0000000c;
  value_type *pvVar8;
  char *fmt;
  uint face_index_00;
  undefined7 in_register_00000081;
  UniquePtr<byte[]> *pUVar9;
  value_type *__x;
  pointer pFVar10;
  Span<const_unsigned_char> data_00;
  Span<const_unsigned_char> data_01;
  _Head_base<0UL,_unsigned_char_*,_false> local_c0;
  Vector<FaceVariation> load_variations;
  Vector<FaceVariation> face_variations;
  String font_face_description;
  
  face_index_00 = (uint)CONCAT71(in_register_00000081,fallback_face);
  face_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  face_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  face_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data_00.m_size = (size_t)&face_variations;
  data_00.m_data = (uchar *)data.m_size;
  pUVar9 = face_memory;
  bVar4 = FreeType::GetFaceVariations
                    ((FreeType *)data.m_data,data_00,
                     (Vector<FaceVariation> *)CONCAT44(in_register_0000000c,face_index),
                     face_index_00);
  if (bVar4) {
    load_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    load_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    load_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (face_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        face_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      font_face_description._M_dataplus._M_p = (pointer)0x0;
      ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::
      emplace_back<Rml::FaceVariation>(&load_variations,(FaceVariation *)&font_face_description);
    }
    else {
      __x = face_variations.
            super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl.
            super__Vector_impl_data._M_start;
      pvVar8 = face_variations.
               super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl.
               super__Vector_impl_data._M_start;
      while (pvVar8 = pvVar8 + 1,
            __x != face_variations.
                   super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
                   _M_impl.super__Vector_impl_data._M_finish) {
        FVar1 = __x->weight;
        if ((font_family.field_2._M_allocated_capacity._0_2_ == 0) ||
           (FVar1 == font_family.field_2._M_allocated_capacity._0_2_)) {
          iVar6 = Math::Absolute(__x->width - 100);
          for (; (pvVar8 != face_variations.
                            super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>
                            ._M_impl.super__Vector_impl_data._M_finish && (pvVar8->weight == FVar1))
              ; pvVar8 = pvVar8 + 1) {
            iVar7 = Math::Absolute(pvVar8->width - 100);
            if (iVar7 < iVar6) {
              iVar6 = iVar7;
              __x = pvVar8;
            }
          }
          ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::push_back
                    (&load_variations,__x);
          __x = pvVar8;
        }
        else {
          __x = __x + 1;
        }
      }
    }
    pFVar3 = load_variations.
             super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl.
             super__Vector_impl_data._M_finish;
    font_family_00._M_p = font_family._M_dataplus._M_p;
    if (load_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        load_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar4 = false;
      Log::Message(LT_ERROR,
                   "Failed to load font face from \'%s\': Could not locate face with weight %d.",
                   (source->_M_dataplus)._M_p,
                   (ulong)(ushort)font_family.field_2._M_allocated_capacity._0_2_);
    }
    else {
      pFVar10 = load_variations.
                super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        bVar4 = pFVar10 == pFVar3;
        if ((bVar4) ||
           (data_01.m_size = (size_t)source, data_01.m_data = (uchar *)data.m_size,
           in_face = FreeType::LoadFace((FreeType *)data.m_data,data_01,
                                        (String *)(ulong)(uint)face_index,
                                        pFVar10->named_instance_index,(int)pUVar9), in_face == 0))
        break;
        if (*(long *)(font_family_00._M_p + 8) == 0) {
          FreeType::GetFaceStyle
                    (in_face,(String *)font_family_00._M_p,
                     (FontStyle *)&font_family._M_string_length,(FontWeight *)0x0);
        }
        if (font_family.field_2._M_allocated_capacity._0_2_ == 0) {
          FreeType::GetFaceStyle
                    (in_face,(String *)0x0,(FontStyle *)0x0,
                     (FontWeight *)&font_family.field_2._M_allocated_capacity);
        }
        uVar2 = pFVar10->weight;
        weight_00 = font_family.field_2._M_allocated_capacity._0_2_;
        if (uVar2 != Auto) {
          weight_00 = uVar2;
        }
        GetFontFaceDescription
                  (&font_face_description,(String *)font_family_00._M_p,
                   (FontStyle)font_family._M_string_length,weight_00);
        local_c0._M_head_impl =
             (face_memory->_M_t).
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        (face_memory->_M_t).
        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
        pUVar9 = (UniquePtr<byte[]> *)(ulong)(face_index_00 & 0xff);
        bVar5 = AddFace(this,in_face,(String *)font_family_00._M_p,
                        (FontStyle)font_family._M_string_length,weight_00,fallback_face,
                        (UniquePtr<byte[]> *)&local_c0);
        ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_c0);
        fmt = "Failed to load font face %s from \'%s\'.";
        if (bVar5) {
          fmt = "Loaded font face %s from \'%s\'.";
        }
        Log::Message((uint)bVar5 + (uint)bVar5 * 2 + LT_ERROR,fmt,
                     font_face_description._M_dataplus._M_p,(source->_M_dataplus)._M_p);
        ::std::__cxx11::string::~string((string *)&font_face_description);
        pFVar10 = pFVar10 + 1;
      } while (bVar5);
    }
    ::std::_Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::~_Vector_base
              (&load_variations.
                super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>);
  }
  else {
    bVar4 = false;
    Log::Message(LT_ERROR,
                 "Failed to load font face from \'%s\': Invalid or unsupported font face file format."
                 ,(source->_M_dataplus)._M_p);
  }
  ::std::_Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::~_Vector_base
            (&face_variations.
              super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>);
  return bVar4;
}

Assistant:

bool FontProvider::LoadFontFace(Span<const byte> data, int face_index, bool fallback_face, UniquePtr<byte[]> face_memory, const String& source, String font_family,
	Style::FontStyle style, Style::FontWeight weight)
{
	using Style::FontWeight;

	Vector<FaceVariation> face_variations;
	if (!FreeType::GetFaceVariations(data, face_variations, face_index))
	{
		Log::Message(Log::LT_ERROR, "Failed to load font face from '%s': Invalid or unsupported font face file format.", source.c_str());
		return false;
	}

	Vector<FaceVariation> load_variations;
	if (face_variations.empty())
	{
		load_variations.push_back(FaceVariation{Style::FontWeight::Auto, 0, 0});
	}
	else
	{
		// Iterate through all the face variations and pick the ones to load. The list is already sorted by (weight, width). When weight is set to
		// 'auto' we load all the weights of the face. However, we only want to load one width for each weight.
		for (auto it = face_variations.begin(); it != face_variations.end();)
		{
			if (weight != FontWeight::Auto && it->weight != weight)
			{
				++it;
				continue;
			}

			// We don't currently have any way for users to select widths, so we search for a regular (medium) value here.
			constexpr int search_width = 100;
			const FontWeight current_weight = it->weight;

			int best_width_distance = Math::Absolute((int)it->width - search_width);
			auto it_best_width = it;

			// Search forward to find the best 'width' with the same weight.
			for (++it; it != face_variations.end(); ++it)
			{
				if (it->weight != current_weight)
					break;

				const int width_distance = Math::Absolute((int)it->width - search_width);
				if (width_distance < best_width_distance)
				{
					best_width_distance = width_distance;
					it_best_width = it;
				}
			}

			load_variations.push_back(*it_best_width);
		}
	}

	if (load_variations.empty())
	{
		Log::Message(Log::LT_ERROR, "Failed to load font face from '%s': Could not locate face with weight %d.", source.c_str(), (int)weight);
		return false;
	}

	for (const FaceVariation& variation : load_variations)
	{
		FontFaceHandleFreetype ft_face = FreeType::LoadFace(data, source, face_index, variation.named_instance_index);
		if (!ft_face)
			return false;

		if (font_family.empty())
			FreeType::GetFaceStyle(ft_face, &font_family, &style, nullptr);
		if (weight == FontWeight::Auto)
			FreeType::GetFaceStyle(ft_face, nullptr, nullptr, &weight);

		const FontWeight variation_weight = (variation.weight == FontWeight::Auto ? weight : variation.weight);
		const String font_face_description = GetFontFaceDescription(font_family, style, variation_weight);

		if (!AddFace(ft_face, font_family, style, variation_weight, fallback_face, std::move(face_memory)))
		{
			Log::Message(Log::LT_ERROR, "Failed to load font face %s from '%s'.", font_face_description.c_str(), source.c_str());
			return false;
		}

		Log::Message(Log::LT_INFO, "Loaded font face %s from '%s'.", font_face_description.c_str(), source.c_str());
	}

	return true;
}